

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<12>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<12> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  PhotonProduction *__variants;
  __index_type _Var1;
  int MT_00;
  _Head_base<5UL,_long,_false> it_00;
  __visit_result_t<L2,_const_std::variant<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>_&>
  _Var2;
  __visit_result_t<N1,_const_std::variant<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>_&>
  _Var3;
  int MT;
  N1 local_9a;
  L2 local_99;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  double local_88;
  double local_80;
  _Head_base<5UL,_long,_false> local_78;
  StructureDivision local_70;
  
  MT_00 = (this->super_Base).MT_;
  local_80 = (double)(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_88 = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  _Var1 = *(__index_type *)
           ((long)&(this->photon_).
                   super__Variant_base<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                   .
                   super__Move_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                   .
                   super__Copy_assign_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                   .
                   super__Move_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                   .
                   super__Copy_ctor_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                   .
                   super__Variant_storage_alias<njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
           + 0xb0);
  __variants = &this->photon_;
  local_98 = MF;
  local_94 = MT_00;
  local_90 = MF;
  local_8c = MAT;
  local_78._M_head_impl = (long)it;
  _Var2 = std::
          visit<njoy::ENDFtk::section::Type<12>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::L2,std::variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>const&>
                    (&local_99,__variants);
  _Var3 = std::
          visit<njoy::ENDFtk::section::Type<12>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::N1,std::variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>const&>
                    (&local_9a,__variants);
  it_00._M_head_impl = local_78._M_head_impl;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = (long)_Var3;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_88;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_80;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)_Var2;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)(char)_Var1 + 1;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78._M_head_impl,MAT,local_98,MT_00);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)it_00._M_head_impl;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)&local_8c;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_90;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&local_94;
  std::
  visit<njoy::ENDFtk::section::Type<12>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<12>::Multiplicities,njoy::ENDFtk::section::Type<12>::TransitionProbabilities>const&>
            ((anon_class_32_4_f17ee1e6 *)&local_70,__variants);
  sectionEndRecord(&local_70,local_8c,local_90);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
            (&local_70,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)it_00._M_head_impl);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  struct L2 {

    int operator()( const Multiplicities& ) { return 0; }
    int operator()( const TransitionProbabilities& value ) {

      return value.LG();
    }
  };

  struct N1 {

    int operator()( const Multiplicities& value ) { return value.NK(); }
    int operator()( const TransitionProbabilities& value ) {

      return value.NT() + 2;
    }
  };

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(), this->LO(),
                 std::visit( L2(), this->photon_ ),
                 std::visit( N1(), this->photon_ ),
                 0 ).print( it, MAT, MF, MT );
  std::visit( [&] ( const auto& v ) -> void
                  { v.print( it, MAT, MF, MT ); },
              this->photon_ );
  SEND( MAT, MF ).print( it );
}